

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hlcv.c
# Opt level: O3

ErrorNumber test_func_per_hlcv(TA_History *history)

{
  double dVar1;
  TA_TestId TVar2;
  TA_RetCode TVar3;
  ErrorNumber EVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  TA_FuncUnstId unstId;
  int iVar8;
  uint integerTolerance;
  TA_Real *pTVar9;
  TA_Test_conflict8 *pTVar10;
  int iVar11;
  int iVar12;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict8 *local_58;
  TA_Real *local_50;
  TA_Real *pTStack_48;
  TA_Real *local_40;
  TA_Real *pTStack_38;
  
  pTVar10 = tableTest;
  uVar5 = 0;
  do {
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    if ((int)history->nbBars < pTVar10->expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar5 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    TVar3 = TA_SetUnstablePeriod(TA_FUNC_UNST_MFI,0);
    if (TVar3 != TA_SUCCESS) {
      uVar6 = 0x8a;
      goto LAB_00119ed0;
    }
    switch(pTVar10->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar10->optInTimePeriod,&outBegIdx,&outNbElement,
                     gBuffer[0].out0);
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119703;
    case TA_ADOSC_5_2_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119703:
      TVar3 = TA_ADOSC(iVar8,iVar7,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar9,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    default:
      TVar3 = 0x140d;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar4 != TA_TEST_PASS))
       || (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
          EVar4 != TA_TEST_PASS)) goto LAB_00119e2f;
    EVar4 = checkExpectedValue(gBuffer[0].out0,TVar3,pTVar10->expectedRetCode,outBegIdx,
                               pTVar10->expectedBegIdx,outNbElement,pTVar10->expectedNbElement,
                               pTVar10->oneOfTheExpectedOutReal0,
                               pTVar10->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119e36;
    outNbElement = 0;
    outBegIdx = 0;
    switch(pTVar10->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar10->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in
                    );
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119899;
    case TA_ADOSC_5_2_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119899:
      TVar3 = TA_ADOSC(iVar8,iVar7,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar9,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    default:
      TVar3 = 0x140e;
    }
    EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar4 != TA_TEST_PASS)
        ) || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[0].in), EVar4 != TA_TEST_PASS))
    goto LAB_00119e2f;
    EVar4 = checkExpectedValue(gBuffer[0].in,TVar3,pTVar10->expectedRetCode,outBegIdx,
                               pTVar10->expectedBegIdx,outNbElement,pTVar10->expectedNbElement,
                               pTVar10->oneOfTheExpectedOutReal0,
                               pTVar10->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119e36;
    setInputBuffer(0,history->high,history->nbBars);
    switch(pTVar10->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar10->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[1].in
                    );
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119a2c;
    case TA_ADOSC_5_2_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119a2c:
      TVar3 = TA_ADOSC(iVar8,iVar7,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar9,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    default:
      TVar3 = 0x140f;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar4 != TA_TEST_PASS)
        ) || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[1].in), EVar4 != TA_TEST_PASS))
    goto LAB_00119e2f;
    EVar4 = checkExpectedValue(gBuffer[1].in,TVar3,pTVar10->expectedRetCode,outBegIdx,
                               pTVar10->expectedBegIdx,outNbElement,pTVar10->expectedNbElement,
                               pTVar10->oneOfTheExpectedOutReal0,
                               pTVar10->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119e36;
    setInputBuffer(1,history->low,history->nbBars);
    switch(pTVar10->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar10->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[2].in
                    );
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar10->startIdx,pTVar10->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[2].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119bc6;
    case TA_ADOSC_5_2_TEST:
      iVar8 = pTVar10->startIdx;
      iVar7 = pTVar10->endIdx;
      pTVar9 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119bc6:
      TVar3 = TA_ADOSC(iVar8,iVar7,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar9,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[2].in);
      break;
    default:
      TVar3 = 0x1410;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar4 != TA_TEST_PASS))
       || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[2].in), EVar4 != TA_TEST_PASS)) {
LAB_00119e2f:
      uVar6 = (ulong)EVar4;
      goto LAB_00119ed0;
    }
    EVar4 = checkExpectedValue(gBuffer[2].in,TVar3,pTVar10->expectedRetCode,outBegIdx,
                               pTVar10->expectedBegIdx,outNbElement,pTVar10->expectedNbElement,
                               pTVar10->oneOfTheExpectedOutReal0,
                               pTVar10->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) {
LAB_00119e36:
      uVar6 = (ulong)EVar4;
      printf("Fail for output id=%d\n",0);
      goto LAB_00119ed0;
    }
    setInputBuffer(2,history->close,history->nbBars);
    if (pTVar10->doRangeTestFlag == 0) {
LAB_00119d38:
      pTVar9 = gBuffer[0].out0;
      if (pTVar10->theFunction == TA_AD_TEST) {
        *gBuffer[0].out0 = -1.0;
        pTVar9[1] = -1.0;
        TVar3 = TA_AD(0,0,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,history->volume,&outBegIdx,
                      &outNbElement,pTVar9);
        if (TVar3 != TA_SUCCESS) {
          printf("Failed AD call for fix #1359452 [%d]\n",(ulong)TVar3);
          uVar6 = 2000;
LAB_00119ed0:
          printf("Failed Test #%d (Code=%d)\n",uVar5 & 0xffffffff,uVar6);
          return (ErrorNumber)uVar6;
        }
        if ((*gBuffer[0].out0 == -1.0) && (!NAN(*gBuffer[0].out0))) {
          puts("Failed AD call for fix #1359452 out0[0] == -1");
          uVar6 = 0x7d1;
          goto LAB_00119ed0;
        }
        TVar3 = TA_AD(1,1,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,history->volume,&outBegIdx,
                      &outNbElement,gBuffer[0].out0 + 1);
        if (TVar3 != TA_SUCCESS) {
          printf("Failed AD call for fix #1359452 [%d]\n",(ulong)TVar3);
          uVar6 = 0x7d3;
          goto LAB_00119ed0;
        }
        dVar1 = gBuffer[0].out0[1];
        if ((dVar1 == -1.0) && (!NAN(dVar1))) {
          puts("Failed AD call for fix #1359452 out0[1] == -1");
          uVar6 = 0x7d4;
          goto LAB_00119ed0;
        }
        if ((dVar1 == *gBuffer[0].out0) && (!NAN(dVar1) && !NAN(*gBuffer[0].out0))) {
          puts("Failed AD logic for fix #1359452");
          uVar6 = 0x7d5;
          goto LAB_00119ed0;
        }
      }
    }
    else {
      local_50 = history->high;
      pTStack_48 = history->low;
      local_40 = history->close;
      pTStack_38 = history->volume;
      TVar2 = pTVar10->theFunction;
      local_58 = pTVar10;
      if (TVar2 - TA_ADOSC_3_10_TEST < 2) {
        unstId = TA_FUNC_UNST_EMA;
LAB_00119d1b:
        integerTolerance = 0xffffffff;
LAB_00119d2b:
        EVar4 = doRangeTest(rangeTestFunction,unstId,&local_58,1,integerTolerance);
        if (EVar4 != TA_TEST_PASS) goto LAB_00119e2f;
        goto LAB_00119d38;
      }
      if (TVar2 == TA_AD_TEST) {
        unstId = TA_FUNC_UNST_NONE;
        goto LAB_00119d1b;
      }
      if (TVar2 == TA_ANY_MA_TEST) {
        unstId = TA_FUNC_UNST_MFI;
        integerTolerance = 0;
        goto LAB_00119d2b;
      }
    }
    uVar5 = uVar5 + 1;
    pTVar10 = pTVar10 + 1;
    if (uVar5 == 0x18) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_per_hlcv( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;


   for( i=0; i < NB_TEST; i++ )
   {
      /* Re-initialize all the unstable period to zero. */
      TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}